

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

JumpStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::JumpStatementSyntax,slang::syntax::JumpStatementSyntax_const&>
          (BumpAllocator *this,JumpStatementSyntax *args)

{
  JumpStatementSyntax *this_00;
  
  this_00 = (JumpStatementSyntax *)allocate(this,0x78,8);
  slang::syntax::JumpStatementSyntax::JumpStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }